

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::MILSpec::Dimension_ConstantDimension::_InternalSerialize
          (Dimension_ConstantDimension *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  void *data;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  int size;
  ulong uVar4;
  uint8_t *puVar5;
  size_t __n;
  
  uVar2 = this->size_;
  puVar5 = target;
  if (uVar2 != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar2 = this->size_;
    }
    *target = '\b';
    target[1] = (byte)uVar2;
    if (uVar2 < 0x80) {
      puVar5 = target + 2;
    }
    else {
      target[1] = (byte)uVar2 | 0x80;
      target[2] = (uint8_t)(uVar2 >> 7);
      puVar5 = target + 3;
      if (0x3fff < uVar2) {
        uVar4 = (ulong)target[2];
        uVar2 = uVar2 >> 7;
        do {
          puVar5[-1] = (byte)uVar4 | 0x80;
          uVar3 = uVar2 >> 7;
          *puVar5 = (uint8_t)uVar3;
          puVar5 = puVar5 + 1;
          uVar4 = uVar3 & 0xffffffff;
          bVar1 = 0x3fff < uVar2;
          uVar2 = uVar3;
        } while (bVar1);
      }
    }
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = uVar2 & 0xfffffffffffffffc;
    data = *(void **)(uVar2 + 8);
    size = (int)*(undefined8 *)(uVar2 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)puVar5 < (long)__n) {
      puVar5 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,puVar5);
      return puVar5;
    }
    memcpy(puVar5,data,__n);
    puVar5 = puVar5 + __n;
  }
  return puVar5;
}

Assistant:

uint8_t* Dimension_ConstantDimension::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.Dimension.ConstantDimension)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 size = 1;
  if (this->_internal_size() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(1, this->_internal_size(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.Dimension.ConstantDimension)
  return target;
}